

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cout.c
# Opt level: O2

char * cout_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *obj;
  csafestring_t *obj_00;
  char *pcVar2;
  char *__format;
  
  obj = modules_extractVariable(line,"value");
  obj_00 = modules_extractVariable(line,"default");
  if (obj == (csafestring_t *)0x0) {
    obj = (csafestring_t *)0x0;
  }
  else {
    iVar1 = safe_strncmp(obj,"${",2);
    if (iVar1 == 0) {
      fwrite("__internal_tmp = ",0x11,1,(FILE *)out);
      expression_eval(out,obj->data,true);
      fwrite(";\n",2,1,(FILE *)out);
      if (obj_00 == (csafestring_t *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = obj_00->data;
      }
      __format = 
      "__internal_hfunction->safe_strcat(__internal_string, (__internal_tmp != NULL) ? __internal_tmp : \"%s\");\n"
      ;
    }
    else {
      pcVar2 = obj->data;
      __format = "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n";
    }
    fprintf((FILE *)out,__format,pcVar2);
  }
  safe_destroy(obj);
  safe_destroy(obj_00);
  pcVar2 = modules_findEndOfTag(line);
  return pcVar2 + 1;
}

Assistant:

static char *cout_openTag(FILE *out, char *line) {
	csafestring_t *value = modules_extractVariable(line, "value");
	csafestring_t *defaultValue = modules_extractVariable(line, "default");

	if ( value == NULL ) {
		safe_destroy(value);
		safe_destroy(defaultValue);
		return modules_findEndOfTag(line) + 1;
	}

	if ( !safe_strncmp(value, "${", 2) ) {
		fprintf(out, "__internal_tmp = ");
		expression_eval(out, value->data, true);
		fprintf(out, ";\n");
		fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, (__internal_tmp != NULL) ? __internal_tmp : \"%s\");\n", ( defaultValue != NULL ) ? defaultValue->data : "");
	} else {
		fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", value->data);
	}

	safe_destroy(value);
	safe_destroy(defaultValue);
	return modules_findEndOfTag(line) + 1;
}